

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

void __thiscall
btSingleSweepCallback::btSingleSweepCallback
          (btSingleSweepCallback *this,btConvexShape *castShape,btTransform *convexFromTrans,
          btTransform *convexToTrans,btCollisionWorld *world,ConvexResultCallback *resultCallback,
          btScalar allowedPenetration)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  
  (this->super_btBroadphaseRayCallback).super_btBroadphaseAabbCallback.
  _vptr_btBroadphaseAabbCallback = (_func_int **)&PTR__btBroadphaseAabbCallback_0021bd48;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_origin.m_floats =
       *(undefined8 *)(convexFromTrans->m_origin).m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_origin.m_floats =
       *(undefined8 *)(convexToTrans->m_origin).m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_origin.m_floats + 2) = uVar1;
  this->m_world = world;
  this->m_resultCallback = resultCallback;
  this->m_allowedCcdPenetration = allowedPenetration;
  this->m_castShape = castShape;
  fVar3 = (this->m_convexToTrans).m_origin.m_floats[2] -
          (this->m_convexFromTrans).m_origin.m_floats[2];
  uVar1 = *(undefined8 *)(this->m_convexFromTrans).m_origin.m_floats;
  uVar2 = *(undefined8 *)(this->m_convexToTrans).m_origin.m_floats;
  fVar4 = (float)uVar2 - (float)uVar1;
  fVar5 = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
  fVar6 = 1.0 / SQRT(fVar3 * fVar3 + fVar4 * fVar4 + fVar5 * fVar5);
  fVar9 = fVar3 * fVar6;
  fVar7 = fVar6 * fVar4;
  fVar8 = fVar6 * fVar5;
  auVar11._4_4_ = fVar8;
  auVar11._0_4_ = fVar7;
  auVar11._8_4_ = fVar6 * 0.0;
  auVar11._12_4_ = fVar6 * 0.0;
  auVar11 = divps(_DAT_001ee3f0,auVar11);
  fVar6 = (float)(-(uint)(fVar7 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar7 == 0.0) & auVar11._0_4_);
  fVar10 = (float)(-(uint)(fVar8 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar8 == 0.0) & auVar11._4_4_);
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[0] = fVar6;
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[1] = fVar10;
  fVar12 = (float)(-(uint)(fVar9 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar9 == 0.0) & (uint)(1.0 / fVar9)
                  );
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[2] = fVar12;
  *(ulong *)(this->super_btBroadphaseRayCallback).m_signs =
       CONCAT44(-(uint)(fVar10 < 0.0),-(uint)(fVar6 < 0.0)) & 0x100000001;
  (this->super_btBroadphaseRayCallback).m_signs[2] = (uint)(fVar12 < 0.0);
  (this->super_btBroadphaseRayCallback).m_lambda_max = fVar9 * fVar3 + fVar7 * fVar4 + fVar5 * fVar8
  ;
  return;
}

Assistant:

btSingleSweepCallback(const btConvexShape* castShape, const btTransform& convexFromTrans,const btTransform& convexToTrans,const btCollisionWorld* world,btCollisionWorld::ConvexResultCallback& resultCallback,btScalar allowedPenetration)
		:m_convexFromTrans(convexFromTrans),
		m_convexToTrans(convexToTrans),
		m_world(world),
		m_resultCallback(resultCallback),
		m_allowedCcdPenetration(allowedPenetration),
		m_castShape(castShape)
	{
		btVector3 unnormalizedRayDir = (m_convexToTrans.getOrigin()-m_convexFromTrans.getOrigin());
		btVector3 rayDir = unnormalizedRayDir.normalized();
		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		m_rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
		m_rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
		m_rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
		m_signs[0] = m_rayDirectionInverse[0] < 0.0;
		m_signs[1] = m_rayDirectionInverse[1] < 0.0;
		m_signs[2] = m_rayDirectionInverse[2] < 0.0;

		m_lambda_max = rayDir.dot(unnormalizedRayDir);

	}